

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_resolver.hpp
# Opt level: O2

results_type * __thiscall
asio::ip::basic_resolver<asio::ip::tcp,_asio::any_io_executor>::resolve
          (results_type *__return_storage_ptr__,
          basic_resolver<asio::ip::tcp,_asio::any_io_executor> *this,string_view host,
          string_view service,flags resolve_flags)

{
  error_code ec;
  basic_resolver_query<asio::ip::tcp> q;
  allocator<char> local_fa;
  allocator<char> local_f9;
  error_code local_f8;
  basic_string_view<char,_std::char_traits<char>_> local_e8;
  string local_d8;
  string local_b8;
  basic_string_view<char,_std::char_traits<char>_> local_98;
  basic_resolver_query<asio::ip::tcp> local_88;
  
  local_e8._M_str = service._M_str;
  local_e8._M_len = service._M_len;
  local_98._M_str = host._M_str;
  local_98._M_len = host._M_len;
  local_f8._M_value = 0;
  local_f8._M_cat = (error_category *)std::_V2::system_category();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)&local_b8,&local_98,&local_f9);
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)&local_d8,&local_e8,&local_fa);
  basic_resolver_query<asio::ip::tcp>::basic_resolver_query
            (&local_88,&local_b8,&local_d8,resolve_flags);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_b8);
  asio::detail::resolver_service<asio::ip::tcp>::resolve
            (__return_storage_ptr__,(this->impl_).service_,&(this->impl_).implementation_,&local_88,
             &local_f8);
  asio::detail::throw_error(&local_f8,"resolve");
  basic_resolver_query<asio::ip::tcp>::~basic_resolver_query(&local_88);
  return __return_storage_ptr__;
}

Assistant:

results_type resolve(ASIO_STRING_VIEW_PARAM host,
      ASIO_STRING_VIEW_PARAM service, resolver_base::flags resolve_flags)
  {
    asio::error_code ec;
    basic_resolver_query<protocol_type> q(static_cast<std::string>(host),
        static_cast<std::string>(service), resolve_flags);
    results_type r = impl_.get_service().resolve(
        impl_.get_implementation(), q, ec);
    asio::detail::throw_error(ec, "resolve");
    return r;
  }